

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20poly1305.h
# Opt level: O0

size_t chacha20poly1305_decrypt
                 (ptls_aead_context_t *_ctx,void *output,void *input,size_t inlen,uint64_t seq,
                 void *aad,size_t aadlen)

{
  int iVar1;
  ptls_aead_context_t *local_60;
  size_t ret;
  uint8_t tag [16];
  chacha20poly1305_context_t *ctx;
  void *aad_local;
  uint64_t seq_local;
  size_t inlen_local;
  void *input_local;
  void *output_local;
  ptls_aead_context_t *_ctx_local;
  
  if (inlen < 0x10) {
    _ctx_local = (ptls_aead_context_t *)0xffffffffffffffff;
  }
  else {
    tag._8_8_ = _ctx;
    chacha20poly1305_init(_ctx,seq,aad,aadlen);
    (**(code **)(tag._8_8_ + 0x80))(tag._8_8_,input,inlen - 0x10);
    *(size_t *)(tag._8_8_ + 0x70) = inlen - 0x10;
    chacha20poly1305_finalize((chacha20poly1305_context_t *)tag._8_8_,(uint8_t *)&ret);
    iVar1 = (*ptls_mem_equal)(&ret,(void *)((long)input + (inlen - 0x10)),0x10);
    if (iVar1 == 0) {
      local_60 = (ptls_aead_context_t *)0xffffffffffffffff;
    }
    else {
      ptls_cipher_encrypt(*(ptls_cipher_context_t **)(tag._8_8_ + 0x50),output,input,inlen - 0x10);
      local_60 = (ptls_aead_context_t *)(inlen - 0x10);
    }
    (*ptls_clear_memory)(&ret,0x10);
    _ctx_local = local_60;
  }
  return (size_t)_ctx_local;
}

Assistant:

static size_t chacha20poly1305_decrypt(ptls_aead_context_t *_ctx, void *output, const void *input, size_t inlen, uint64_t seq,
                                       const void *aad, size_t aadlen)
{
    struct chacha20poly1305_context_t *ctx = (struct chacha20poly1305_context_t *)_ctx;
    uint8_t tag[PTLS_CHACHA20POLY1305_TAG_SIZE];
    size_t ret;

    if (inlen < sizeof(tag))
        return SIZE_MAX;

    chacha20poly1305_init(&ctx->super, seq, aad, aadlen);

    ctx->poly1305_update(ctx, input, inlen - sizeof(tag));
    ctx->textlen = inlen - sizeof(tag);

    chacha20poly1305_finalize(ctx, tag);
    if (ptls_mem_equal(tag, (const uint8_t *)input + inlen - sizeof(tag), sizeof(tag))) {
        ptls_cipher_encrypt(ctx->chacha, output, input, inlen - sizeof(tag));
        ret = inlen - sizeof(tag);
    } else {
        ret = SIZE_MAX;
    }

    ptls_clear_memory(tag, sizeof(tag));

    return ret;
}